

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_accessors_kernels.h
# Opt level: O0

size_t ind_state(Dimensions dims,int nu,int ix,int iy,int iz,int ie,int im,int iu)

{
  int im_local;
  int ie_local;
  int iz_local;
  int iy_local;
  int ix_local;
  int nu_local;
  
  if (nu < 1) {
    __assert_fail("nu > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                  ,0x4a,
                  "size_t ind_state(const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                 );
  }
  if ((ix < 0) || (dims.ncell_x <= ix)) {
    __assert_fail("ix >= 0 && ix < dims.ncell_x",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                  ,0x4b,
                  "size_t ind_state(const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                 );
  }
  if ((iy < 0) || (dims.ncell_y <= iy)) {
    __assert_fail("iy >= 0 && iy < dims.ncell_y",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                  ,0x4c,
                  "size_t ind_state(const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                 );
  }
  if ((-1 < iz) && (iz < dims.ncell_z)) {
    if ((ie < 0) || (dims.ne <= ie)) {
      __assert_fail("ie >= 0 && ie < dims.ne",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                    ,0x4e,
                    "size_t ind_state(const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                   );
    }
    if ((-1 < im) && (im < dims.nm)) {
      if ((-1 < iu) && (iu < nu)) {
        return (long)(im + dims.nm * (iu + nu * (ix + dims.ncell_x *
                                                      (iy + dims.ncell_y * (ie + dims.ne * iz)))));
      }
      __assert_fail("iu >= 0 && iu < nu",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                    ,0x50,
                    "size_t ind_state(const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                   );
    }
    __assert_fail("im >= 0 && im < dims.nm",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                  ,0x4f,
                  "size_t ind_state(const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                 );
  }
  __assert_fail("iz >= 0 && iz < dims.ncell_z",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                ,0x4d,
                "size_t ind_state(const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
               );
}

Assistant:

TARGET_HD static inline size_t ind_state(
    const Dimensions dims,
    const int        nu,
    const int        ix,
    const int        iy,
    const int        iz,
    const int        ie,
    const int        im,
    const int        iu )
{
  Assert( nu > 0 );
  Assert( ix >= 0 && ix < dims.ncell_x );
  Assert( iy >= 0 && iy < dims.ncell_y );
  Assert( iz >= 0 && iz < dims.ncell_z );
  Assert( ie >= 0 && ie < dims.ne );
  Assert( im >= 0 && im < dims.nm );
  Assert( iu >= 0 && iu < nu );

  return  im + dims.nm      * (
          iu + nu           * (
          ix + dims.ncell_x * (
          iy + dims.ncell_y * (
          ie + dims.ne      * (
          iz + dims.ncell_z * ( /*---NOTE: This axis MUST be slowest-varying---*/
          0 ))))));
}